

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Miter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Gia_Man_t *pNew;
  char *pcVar6;
  FILE *__stream;
  Gia_Man_t *pGVar7;
  int iVar8;
  uint fVerbose;
  char *pcVar9;
  uint fDualOut;
  uint fSeq;
  uint local_54;
  
  local_54 = 0;
  Extra_UtilGetoptReset();
  fDualOut = 0;
  fSeq = 0;
  bVar4 = false;
  bVar1 = false;
  bVar3 = false;
  bVar2 = false;
  fVerbose = 0;
  do {
    iVar5 = Extra_UtilGetopt(argc,argv,"Idstxyzvh");
    iVar8 = globalUtilOptind;
    switch(iVar5) {
    case 0x73:
      fSeq = fSeq ^ 1;
      break;
    case 0x74:
      bVar4 = (bool)(bVar4 ^ 1);
      break;
    case 0x75:
    case 0x77:
      goto switchD_0024c656_caseD_75;
    case 0x76:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x78:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x79:
      bVar3 = (bool)(bVar3 ^ 1);
      break;
    case 0x7a:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    default:
      if (iVar5 == 0x49) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-I\" should be followed by a char string.\n");
          goto switchD_0024c656_caseD_75;
        }
        local_54 = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar8 + 1;
        if ((int)local_54 < 0) {
switchD_0024c656_caseD_75:
          iVar8 = -2;
          Abc_Print(-2,"usage: &miter [-I num] [-dstxyzvh] <file>\n");
          Abc_Print(-2,"\t         creates miter of two designs (current AIG vs. <file>)\n");
          Abc_Print(-2,"\t-I num : the number of last PIs to replicate [default = %d]\n",
                    (ulong)local_54);
          pcVar6 = "yes";
          pcVar9 = "yes";
          if (fDualOut == 0) {
            pcVar9 = "no";
          }
          Abc_Print(-2,"\t-d     : toggle creating dual-output miter [default = %s]\n",pcVar9);
          pcVar9 = "yes";
          if (fSeq == 0) {
            pcVar9 = "no";
          }
          Abc_Print(-2,"\t-s     : toggle creating sequential miter [default = %s]\n",pcVar9);
          pcVar9 = "yes";
          if (!bVar4) {
            pcVar9 = "no";
          }
          Abc_Print(-2,"\t-t     : toggle XORing POs of dual-output miter [default = %s]\n",pcVar9);
          pcVar9 = "yes";
          if (!bVar1) {
            pcVar9 = "no";
          }
          Abc_Print(-2,"\t-x     : toggle XORing POs of two-word miter [default = %s]\n",pcVar9);
          pcVar9 = "yes";
          if (!bVar3) {
            pcVar9 = "no";
          }
          Abc_Print(-2,
                    "\t-y     : toggle convering two-word miter into dual-output miter [default = %s]\n"
                    ,pcVar9);
          pcVar9 = "yes";
          if (!bVar2) {
            pcVar9 = "no";
          }
          Abc_Print(-2,"\t-z     : toggle odering sides of the dual-output miter [default = %s]\n",
                    pcVar9);
          if (fVerbose == 0) {
            pcVar6 = "no";
          }
          Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
          Abc_Print(-2,"\t-h     : print the command usage\n");
          pcVar9 = "\t<file> : AIGER file with the design to miter\n";
LAB_0024c893:
          Abc_Print(iVar8,pcVar9);
          return 1;
        }
      }
      else {
        if (iVar5 != 100) {
          if (iVar5 == -1) {
            if (((bVar4 || bVar1) || bVar2) || bVar3) {
              pGVar7 = pAbc->pGia;
              if (pGVar7 != (Gia_Man_t *)0x0) {
                if ((pGVar7->vCos->nSize - pGVar7->nRegs & 1U) != 0) {
                  pcVar9 = "Abc_CommandAbc9Miter(): The number of outputs should be even.\n";
                  goto LAB_0024c9e3;
                }
                if (bVar4) {
                  pNew = Gia_ManTransformMiter(pGVar7);
                  pcVar9 = "The miter (current AIG) is transformed by XORing POs pair-wise.\n";
                }
                else if (bVar1) {
                  pNew = Gia_ManTransformMiter2(pGVar7);
                  pcVar9 = 
                  "The miter (current AIG) is transformed by XORing POs of two word-level outputs.\n"
                  ;
                }
                else if (bVar2) {
                  pNew = Gia_ManTransformDualOutput(pGVar7);
                  pcVar9 = "The dual-output miter (current AIG) is transformed by ordering sides.\n"
                  ;
                }
                else {
                  pNew = Gia_ManTransformTwoWord2DualOutput(pGVar7);
                  pcVar9 = "The miter (current AIG) is transformed from two-word to dual-output.\n";
                }
                Abc_Print(1,pcVar9);
                goto LAB_0024ca24;
              }
              pcVar9 = "Abc_CommandAbc9Miter(): There is no AIG.\n";
            }
            else {
              if (argc - globalUtilOptind == 1) {
                pcVar9 = argv[globalUtilOptind];
                pcVar6 = pcVar9;
                goto LAB_0024c8cf;
              }
              pcVar9 = "File name is not given on the command line.\n";
            }
            iVar8 = -1;
            goto LAB_0024c893;
          }
          goto switchD_0024c656_caseD_75;
        }
        fDualOut = fDualOut ^ 1;
      }
    }
  } while( true );
LAB_0024c8cf:
  if (*pcVar6 == '>') {
    *pcVar6 = '\\';
  }
  else if (*pcVar6 == '\0') {
    __stream = fopen(pcVar9,"r");
    if (__stream == (FILE *)0x0) {
      Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar9);
      pcVar9 = Extra_FileGetSimilarName
                         (pcVar9,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (pcVar9 != (char *)0x0) {
        Abc_Print(1,"Did you mean \"%s\"?",pcVar9);
      }
      pcVar9 = "\n";
      iVar8 = 1;
      iVar5 = iVar8;
    }
    else {
      fclose(__stream);
      pGVar7 = Gia_AigerRead(pcVar9,0,0,0);
      if (pGVar7 != (Gia_Man_t *)0x0) {
        pNew = Gia_ManMiter(pAbc->pGia,pGVar7,local_54,fDualOut,fSeq,0,fVerbose);
        Gia_ManStop(pGVar7);
LAB_0024ca24:
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      pcVar9 = "Reading AIGER has failed.\n";
LAB_0024c9e3:
      iVar8 = -1;
      iVar5 = 0;
    }
    Abc_Print(iVar8,pcVar9);
    return iVar5;
  }
  pcVar6 = pcVar6 + 1;
  goto LAB_0024c8cf;
}

Assistant:

int Abc_CommandAbc9Miter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Gia_Man_t * pAux;
    Gia_Man_t * pSecond;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int nInsDup  = 0;
    int fDualOut = 0;
    int fSeq     = 0;
    int fTrans   = 0;
    int fTransX  = 0;
    int fConvert = 0;
    int fTransZ  = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Idstxyzvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a char string.\n" );
                goto usage;
            }
            nInsDup = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsDup < 0 )
                goto usage;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 't':
            fTrans ^= 1;
            break;
        case 'x':
            fTransX ^= 1;
            break;
        case 'y':
            fConvert ^= 1;
            break;
        case 'z':
            fTransZ ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fTrans || fTransX || fTransZ || fConvert )
    {
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Miter(): There is no AIG.\n" );
            return 1;
        }
        if ( (Gia_ManPoNum(pAbc->pGia) & 1) == 1 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Miter(): The number of outputs should be even.\n" );
            return 0;
        }
        if ( fTrans )
        {
            pAux = Gia_ManTransformMiter( pAbc->pGia );
            Abc_Print( 1, "The miter (current AIG) is transformed by XORing POs pair-wise.\n" );
        }
        else if ( fTransX )
        {
            pAux = Gia_ManTransformMiter2( pAbc->pGia );
            Abc_Print( 1, "The miter (current AIG) is transformed by XORing POs of two word-level outputs.\n" );
        }
        else if ( fTransZ ) 
        {
            extern Gia_Man_t * Gia_ManTransformDualOutput( Gia_Man_t * p );
            pAux = Gia_ManTransformDualOutput( pAbc->pGia );
            Abc_Print( 1, "The dual-output miter (current AIG) is transformed by ordering sides.\n" );
        }
        else
        {
            pAux = Gia_ManTransformTwoWord2DualOutput( pAbc->pGia );
            Abc_Print( 1, "The miter (current AIG) is transformed from two-word to dual-output.\n" );
        }
        Abc_FrameUpdateGia( pAbc, pAux );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    // compute the miter
    pAux = Gia_ManMiter( pAbc->pGia, pSecond, nInsDup, fDualOut, fSeq, 0, fVerbose );
    Gia_ManStop( pSecond );
    Abc_FrameUpdateGia( pAbc, pAux );
    return 0;

usage:
    Abc_Print( -2, "usage: &miter [-I num] [-dstxyzvh] <file>\n" );
    Abc_Print( -2, "\t         creates miter of two designs (current AIG vs. <file>)\n" );
    Abc_Print( -2, "\t-I num : the number of last PIs to replicate [default = %d]\n", nInsDup );
    Abc_Print( -2, "\t-d     : toggle creating dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle creating sequential miter [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle XORing POs of dual-output miter [default = %s]\n", fTrans? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle XORing POs of two-word miter [default = %s]\n", fTransX? "yes": "no" );
    Abc_Print( -2, "\t-y     : toggle convering two-word miter into dual-output miter [default = %s]\n", fConvert? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle odering sides of the dual-output miter [default = %s]\n", fTransZ? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the design to miter\n");
    return 1;
}